

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O1

vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> * __thiscall
cnn::Tensor::batch_elems
          (vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__return_storage_ptr__,Tensor *this)

{
  undefined8 *puVar1;
  pointer pTVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *bs;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  int iVar20;
  undefined1 local_c8 [16];
  pointer local_b8;
  Tensor *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined4 local_88;
  undefined4 uStack_84;
  float *local_80;
  undefined1 local_78 [16];
  pointer local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  uVar9 = (ulong)(this->d).bd;
  if (uVar9 == 1) {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,1,this,(allocator_type *)&local_a8);
  }
  else {
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
              (__return_storage_ptr__,uVar9,(allocator_type *)&local_a8);
    uVar9 = (ulong)(this->d).nd;
    if (uVar9 == 0) {
      iVar20 = 1;
    }
    else {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar10 = 0;
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar18 = vmovdqa64_avx512f(auVar15);
        auVar15 = vpbroadcastq_avx512f();
        auVar19 = vporq_avx512f(auVar15,auVar16);
        auVar15 = vporq_avx512f(auVar15,auVar17);
        uVar6 = vpcmpuq_avx512f(auVar15,auVar14,2);
        bVar7 = (byte)uVar6;
        uVar6 = vpcmpuq_avx512f(auVar19,auVar14,2);
        bVar8 = (byte)uVar6;
        uVar12 = CONCAT11(bVar8,bVar7);
        auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->d).d + uVar10));
        auVar19._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
        auVar19._0_4_ = (uint)(bVar7 & 1) * auVar15._0_4_;
        auVar19._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
        auVar19._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
        auVar19._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
        auVar19._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
        auVar19._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
        auVar19._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
        auVar19._32_4_ = (uint)(bVar8 & 1) * auVar15._32_4_;
        auVar19._36_4_ = (uint)(bVar8 >> 1 & 1) * auVar15._36_4_;
        auVar19._40_4_ = (uint)(bVar8 >> 2 & 1) * auVar15._40_4_;
        auVar19._44_4_ = (uint)(bVar8 >> 3 & 1) * auVar15._44_4_;
        auVar19._48_4_ = (uint)(bVar8 >> 4 & 1) * auVar15._48_4_;
        auVar19._52_4_ = (uint)(bVar8 >> 5 & 1) * auVar15._52_4_;
        auVar19._56_4_ = (uint)(bVar8 >> 6 & 1) * auVar15._56_4_;
        auVar19._60_4_ = (uint)(bVar8 >> 7) * auVar15._60_4_;
        auVar15 = vpmulld_avx512f(auVar19,auVar18);
        uVar10 = uVar10 + 0x10;
      } while ((uVar9 + 0xf & 0xfffffffffffffff0) != uVar10);
      auVar14 = vmovdqa32_avx512f(auVar15);
      auVar15._0_4_ = (uint)(bVar7 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._0_4_;
      bVar3 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar15._4_4_ = (uint)bVar3 * auVar14._4_4_ | (uint)!bVar3 * auVar18._4_4_;
      bVar3 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar15._8_4_ = (uint)bVar3 * auVar14._8_4_ | (uint)!bVar3 * auVar18._8_4_;
      bVar3 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar15._12_4_ = (uint)bVar3 * auVar14._12_4_ | (uint)!bVar3 * auVar18._12_4_;
      bVar3 = (bool)((byte)(uVar12 >> 4) & 1);
      auVar15._16_4_ = (uint)bVar3 * auVar14._16_4_ | (uint)!bVar3 * auVar18._16_4_;
      bVar3 = (bool)((byte)(uVar12 >> 5) & 1);
      auVar15._20_4_ = (uint)bVar3 * auVar14._20_4_ | (uint)!bVar3 * auVar18._20_4_;
      bVar3 = (bool)((byte)(uVar12 >> 6) & 1);
      auVar15._24_4_ = (uint)bVar3 * auVar14._24_4_ | (uint)!bVar3 * auVar18._24_4_;
      bVar3 = (bool)((byte)(uVar12 >> 7) & 1);
      auVar15._28_4_ = (uint)bVar3 * auVar14._28_4_ | (uint)!bVar3 * auVar18._28_4_;
      auVar15._32_4_ =
           (uint)(bVar8 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar8 & 1) * auVar18._32_4_;
      bVar3 = (bool)(bVar8 >> 1 & 1);
      auVar15._36_4_ = (uint)bVar3 * auVar14._36_4_ | (uint)!bVar3 * auVar18._36_4_;
      bVar3 = (bool)(bVar8 >> 2 & 1);
      auVar15._40_4_ = (uint)bVar3 * auVar14._40_4_ | (uint)!bVar3 * auVar18._40_4_;
      bVar3 = (bool)(bVar8 >> 3 & 1);
      auVar15._44_4_ = (uint)bVar3 * auVar14._44_4_ | (uint)!bVar3 * auVar18._44_4_;
      bVar3 = (bool)(bVar8 >> 4 & 1);
      auVar15._48_4_ = (uint)bVar3 * auVar14._48_4_ | (uint)!bVar3 * auVar18._48_4_;
      bVar3 = (bool)(bVar8 >> 5 & 1);
      auVar15._52_4_ = (uint)bVar3 * auVar14._52_4_ | (uint)!bVar3 * auVar18._52_4_;
      bVar3 = (bool)(bVar8 >> 6 & 1);
      auVar15._56_4_ = (uint)bVar3 * auVar14._56_4_ | (uint)!bVar3 * auVar18._56_4_;
      auVar15._60_4_ =
           (uint)(bVar8 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar8 >> 7) * auVar18._60_4_;
      auVar13 = vextracti64x4_avx512f(auVar15,1);
      auVar14 = vpmulld_avx512f(auVar15,ZEXT3264(auVar13));
      auVar4 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      auVar5 = vpshufd_avx(auVar4,0x55);
      auVar4 = vpmulld_avx(auVar4,auVar5);
      iVar20 = auVar4._0_4_;
    }
    local_58 = *(undefined8 *)(this->d).d;
    uStack_50 = *(undefined8 *)((this->d).d + 2);
    uStack_48 = *(undefined8 *)((this->d).d + 4);
    uStack_40 = *(undefined8 *)((this->d).d + 6);
    if ((this->d).bd != 0) {
      lVar11 = 0x40;
      uVar9 = 0;
      uVar10 = 0;
      local_b0 = this;
      do {
        local_80 = this->v + uVar9;
        local_a8 = local_58;
        uStack_a0 = uStack_50;
        uStack_98 = uStack_48;
        uStack_90 = uStack_40;
        local_88 = 1;
        pTVar2 = (__return_storage_ptr__->
                 super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar11 + -0x30);
        *puVar1 = uStack_48;
        puVar1[1] = uStack_40;
        puVar1[2] = CONCAT44(uStack_84,1);
        puVar1[3] = local_80;
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar11 + -0x40);
        *puVar1 = local_58;
        puVar1[1] = uStack_50;
        puVar1[2] = uStack_48;
        puVar1[3] = uStack_40;
        local_c8 = *(undefined1 (*) [16])((long)(pTVar2->d).d + lVar11 + -0x10);
        local_b8 = *(pointer *)((long)(pTVar2->d).d + lVar11);
        puVar1 = (undefined8 *)((long)(pTVar2->d).d + lVar11 + -0x10);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)(pTVar2->d).d + lVar11) = 0;
        local_78 = ZEXT816(0);
        local_68 = (pointer)0x0;
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector
                  ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)local_c8);
        this = local_b0;
        std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::~vector
                  ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)local_78);
        uVar10 = uVar10 + 1;
        lVar11 = lVar11 + 0x48;
        uVar9 = (ulong)(uint)((int)uVar9 + iVar20);
      } while (uVar10 < (this->d).bd);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Tensor> batch_elems() const {
    if(d.batch_elems() == 1) {
      return std::vector<Tensor>(1, *this); 
    } else {
      std::vector<Tensor> bs(d.batch_elems());
      unsigned bsize = d.batch_size();
      Dim new_d = d; new_d.bd = 1;
      assert (d.batch_elems() >= 0);
      for(unsigned b = 0; b < d.batch_elems(); ++b)
        bs[b] = Tensor(new_d, v + bsize * b);
      return bs;
    }
  }